

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isSeamplessLinearMipmapLinearCompareResultValid
               (TextureCubeView *texture,int baseLevelNdx,Sampler *sampler,TexComparePrecision *prec
               ,CubeFaceFloatCoords *coords,Vec2 *fBounds,float cmpReference,float result)

{
  CubeFace CVar1;
  CompareMode compareMode;
  ulong uVar2;
  bool isFixedPointDepth_00;
  bool bVar3;
  int dim;
  int dim_00;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  ConstPixelBufferAccess *pCVar10;
  TextureFormat *format;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  CubeFaceIntCoords CVar24;
  ConstPixelBufferAccess *local_508;
  ConstPixelBufferAccess *local_4b0;
  Vector<float,_2> local_4a8;
  Vector<float,_2> local_4a0;
  Vector<float,_2> local_498;
  Vector<float,_2> local_490;
  CubeFaceIntCoords local_488;
  Vector<int,_2> local_478;
  CubeFaceCoords<int> local_470;
  undefined8 local_464;
  CubeFaceIntCoords c11_1;
  CubeFace local_450;
  Vector<int,_2> local_444;
  CubeFaceCoords<int> local_43c;
  undefined8 local_430;
  CubeFaceIntCoords c01_1;
  CubeFace local_418;
  Vector<int,_2> local_40c;
  CubeFaceCoords<int> local_404;
  undefined8 local_3f8;
  CubeFaceIntCoords c10_1;
  CubeFace local_3e0;
  Vector<int,_2> local_3d4;
  CubeFaceCoords<int> local_3cc;
  undefined8 local_3c0;
  CubeFaceIntCoords c00_1;
  Vec4 depths1;
  float maxB1;
  float minB1;
  float maxA1;
  float minA1;
  int i1;
  int j1;
  CubeFace local_380;
  Vector<int,_2> local_378;
  CubeFaceCoords<int> local_370;
  undefined8 local_364;
  CubeFaceIntCoords c11;
  CubeFace local_350;
  Vector<int,_2> local_344;
  CubeFaceCoords<int> local_33c;
  undefined8 local_330;
  CubeFaceIntCoords c01;
  CubeFace local_318;
  Vector<int,_2> local_30c;
  CubeFaceCoords<int> local_304;
  undefined8 local_2f8;
  CubeFaceIntCoords c10;
  CubeFace local_2e0;
  Vector<int,_2> local_2d4;
  CubeFaceCoords<int> local_2cc;
  undefined8 local_2c0;
  CubeFaceIntCoords c00;
  Vec4 depths0;
  float maxB0;
  float minB0;
  float maxA0;
  float minA0;
  int i0;
  int j0;
  int face;
  ConstPixelBufferAccess faces1 [6];
  ConstPixelBufferAccess faces0 [6];
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int size1;
  int size0;
  bool isFixedPointDepth;
  float result_local;
  float cmpReference_local;
  Vec2 *fBounds_local;
  CubeFaceFloatCoords *coords_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  int baseLevelNdx_local;
  TextureCubeView *texture_local;
  
  pCVar10 = TextureCubeView::getLevelFace(texture,baseLevelNdx,CUBEFACE_NEGATIVE_X);
  format = ConstPixelBufferAccess::getFormat(pCVar10);
  isFixedPointDepth_00 = isFixedPointDepthTextureFormat(format);
  pCVar10 = TextureCubeView::getLevelFace(texture,baseLevelNdx,coords->face);
  dim = ConstPixelBufferAccess::getWidth(pCVar10);
  pCVar10 = TextureCubeView::getLevelFace(texture,baseLevelNdx + 1,coords->face);
  dim_00 = ConstPixelBufferAccess::getWidth(pCVar10);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->s;
  iVar4 = Vector<int,_3>::x((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar3 & 1),dim,fVar12,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->s;
  iVar4 = Vector<int,_3>::x((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar3 & 1),dim_00,fVar12,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->t;
  iVar4 = Vector<int,_3>::y((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar3 & 1),dim,fVar12,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->t;
  iVar4 = Vector<int,_3>::y((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar3 & 1),dim_00,fVar12,iVar4,iVar5);
  fVar12 = Vector<float,_2>::x(&uBounds1);
  fVar12 = (float)deFloorFloatToInt32(fVar12 - 0.5);
  fVar13 = Vector<float,_2>::y(&uBounds1);
  dVar6 = deFloorFloatToInt32(fVar13 - 0.5);
  fVar13 = Vector<float,_2>::x(&vBounds0);
  fVar13 = (float)deFloorFloatToInt32(fVar13 - 0.5);
  fVar14 = Vector<float,_2>::y(&vBounds0);
  dVar7 = deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::x(&vBounds1);
  minA0 = (float)deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::y(&vBounds1);
  dVar8 = deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar14 = (float)deFloorFloatToInt32(fVar14 - 0.5);
  fVar15 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar9 = deFloorFloatToInt32(fVar15 - 0.5);
  local_4b0 = (ConstPixelBufferAccess *)&faces1[5].m_data;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess(local_4b0);
    local_4b0 = local_4b0 + 1;
  } while (local_4b0 != (ConstPixelBufferAccess *)&faces0[5].m_data);
  local_508 = (ConstPixelBufferAccess *)&j0;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess(local_508);
    local_508 = local_508 + 1;
  } while (local_508 != (ConstPixelBufferAccess *)&faces1[5].m_data);
  for (i0 = 0; i0 < 6; i0 = i0 + 1) {
    pCVar10 = TextureCubeView::getLevelFace(texture,baseLevelNdx,i0);
    memcpy(&faces1[(long)i0 + 5].m_data,pCVar10,0x28);
    pCVar10 = TextureCubeView::getLevelFace(texture,baseLevelNdx + 1,i0);
    memcpy(&j0 + (long)i0 * 10,pCVar10,0x28);
  }
  do {
    maxA0 = fVar12;
    if (dVar8 < (int)minA0) {
      return false;
    }
    for (; (int)maxA0 <= dVar6; maxA0 = (float)((int)maxA0 + 1)) {
      fVar15 = Vector<float,_2>::x(&uBounds1);
      fVar15 = de::clamp<float>((fVar15 - 0.5) - (float)(int)maxA0,0.0,1.0);
      fVar16 = Vector<float,_2>::y(&uBounds1);
      fVar16 = de::clamp<float>((fVar16 - 0.5) - (float)(int)maxA0,0.0,1.0);
      fVar17 = Vector<float,_2>::x(&vBounds1);
      fVar17 = de::clamp<float>((fVar17 - 0.5) - (float)(int)minA0,0.0,1.0);
      fVar18 = Vector<float,_2>::y(&vBounds1);
      fVar18 = de::clamp<float>((fVar18 - 0.5) - (float)(int)minA0,0.0,1.0);
      Vector<float,_4>::Vector((Vector<float,_4> *)&c00.s);
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_2d4,(int)maxA0,(int)minA0);
      CubeFaceCoords<int>::CubeFaceCoords(&local_2cc,CVar1,&local_2d4);
      join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_2cc,dim);
      c00.face = local_2e0;
      local_2c0 = stack0xfffffffffffffd18;
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_30c,(int)maxA0 + 1,(int)minA0);
      CubeFaceCoords<int>::CubeFaceCoords(&local_304,CVar1,&local_30c);
      join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_304,dim);
      c10.face = local_318;
      local_2f8 = stack0xfffffffffffffce0;
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_344,(int)maxA0,(int)minA0 + 1);
      CubeFaceCoords<int>::CubeFaceCoords(&local_33c,CVar1,&local_344);
      CVar24 = remapCubeEdgeCoords(&local_33c,dim);
      local_350 = CVar24.t;
      c01.face = local_350;
      c11._4_8_ = CVar24._0_8_;
      local_330._0_4_ = c11.s;
      local_330._4_4_ = c11.t;
      CVar1 = coords->face;
      unique0x10000d8e = CVar24;
      Vector<int,_2>::Vector(&local_378,(int)maxA0 + 1,(int)minA0 + 1);
      CubeFaceCoords<int>::CubeFaceCoords(&local_370,CVar1,&local_378);
      CVar24 = remapCubeEdgeCoords(&local_370,dim);
      _i1 = CVar24._0_8_;
      local_364 = _i1;
      uVar2 = local_364;
      local_380 = CVar24.t;
      c11.face = local_380;
      if (((((int)local_2c0 == 6) || ((int)local_330 == 6)) || ((int)local_2f8 == 6)) ||
         (local_364._0_4_ = CVar24.face, (CubeFace)local_364 == CUBEFACE_LAST)) {
        return true;
      }
      local_364 = uVar2;
      fVar19 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                   &faces1[(local_2c0 & 0xffffffff) + 5].m_data,sampler,
                                   local_2c0._4_4_,c00.face,0);
      pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00.s,0);
      *pfVar11 = fVar19;
      fVar19 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                   &faces1[(local_2f8 & 0xffffffff) + 5].m_data,sampler,
                                   local_2f8._4_4_,c10.face,0);
      pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00.s,1);
      *pfVar11 = fVar19;
      fVar19 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                   &faces1[(local_330 & 0xffffffff) + 5].m_data,sampler,
                                   local_330._4_4_,c01.face,0);
      pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00.s,2);
      *pfVar11 = fVar19;
      fVar19 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                   &faces1[(local_364 & 0xffffffff) + 5].m_data,sampler,
                                   local_364._4_4_,c11.face,0);
      pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00.s,3);
      *pfVar11 = fVar19;
      for (minA1 = fVar14; maxA1 = fVar13, (int)minA1 <= dVar9; minA1 = (float)((int)minA1 + 1)) {
        for (; (int)maxA1 <= dVar7; maxA1 = (float)((int)maxA1 + 1)) {
          fVar19 = Vector<float,_2>::x(&vBounds0);
          fVar19 = de::clamp<float>((fVar19 - 0.5) - (float)(int)maxA1,0.0,1.0);
          fVar20 = Vector<float,_2>::y(&vBounds0);
          fVar20 = de::clamp<float>((fVar20 - 0.5) - (float)(int)maxA1,0.0,1.0);
          fVar21 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
          fVar21 = de::clamp<float>((fVar21 - 0.5) - (float)(int)minA1,0.0,1.0);
          fVar22 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
          fVar22 = de::clamp<float>((fVar22 - 0.5) - (float)(int)minA1,0.0,1.0);
          Vector<float,_4>::Vector((Vector<float,_4> *)&c00_1.t);
          CVar1 = coords->face;
          Vector<int,_2>::Vector(&local_3d4,(int)maxA1,(int)minA1);
          CubeFaceCoords<int>::CubeFaceCoords(&local_3cc,CVar1,&local_3d4);
          join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_3cc,dim_00);
          c00_1.face = local_3e0;
          local_3c0 = stack0xfffffffffffffc18;
          CVar1 = coords->face;
          Vector<int,_2>::Vector(&local_40c,(int)maxA1 + 1,(int)minA1);
          CubeFaceCoords<int>::CubeFaceCoords(&local_404,CVar1,&local_40c);
          join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_404,dim_00);
          c10_1.face = local_418;
          local_3f8 = stack0xfffffffffffffbe0;
          CVar1 = coords->face;
          Vector<int,_2>::Vector(&local_444,(int)maxA1,(int)minA1 + 1);
          CubeFaceCoords<int>::CubeFaceCoords(&local_43c,CVar1,&local_444);
          CVar24 = remapCubeEdgeCoords(&local_43c,dim_00);
          local_450 = CVar24.t;
          c01_1.face = local_450;
          c11_1._4_8_ = CVar24._0_8_;
          local_430._0_4_ = c11_1.s;
          local_430._4_4_ = c11_1.t;
          CVar1 = coords->face;
          unique0x10000d6e = CVar24;
          Vector<int,_2>::Vector(&local_478,(int)maxA1 + 1,(int)minA1 + 1);
          CubeFaceCoords<int>::CubeFaceCoords(&local_470,CVar1,&local_478);
          CVar24 = remapCubeEdgeCoords(&local_470,dim_00);
          local_488._0_8_ = CVar24._0_8_;
          local_464._0_4_ = local_488.face;
          local_464._4_4_ = local_488.s;
          uVar2 = local_464;
          local_488.t = CVar24.t;
          c11_1.face = local_488.t;
          if ((((int)local_3c0 == 6) || ((int)local_430 == 6)) ||
             (((int)local_3f8 == 6 ||
              (local_464._0_4_ = CVar24.face, (CubeFace)local_464 == CUBEFACE_LAST)))) {
            return true;
          }
          local_488 = CVar24;
          local_464 = uVar2;
          fVar23 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                       (&j0 + (local_3c0 & 0xffffffff) * 10),sampler,local_3c0._4_4_
                                       ,c00_1.face,0);
          pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00_1.t,0);
          *pfVar11 = fVar23;
          fVar23 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                       (&j0 + (local_3f8 & 0xffffffff) * 10),sampler,local_3f8._4_4_
                                       ,c10_1.face,0);
          pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00_1.t,1);
          *pfVar11 = fVar23;
          fVar23 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                       (&j0 + (local_430 & 0xffffffff) * 10),sampler,local_430._4_4_
                                       ,c01_1.face,0);
          pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00_1.t,2);
          *pfVar11 = fVar23;
          fVar23 = lookupDepthNoBorder((ConstPixelBufferAccess *)
                                       (&j0 + (local_464 & 0xffffffff) * 10),sampler,local_464._4_4_
                                       ,c11_1.face,0);
          pfVar11 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c00_1.t,3);
          *pfVar11 = fVar23;
          compareMode = sampler->compare;
          Vector<float,_2>::Vector(&local_490,fVar15,fVar16);
          Vector<float,_2>::Vector(&local_498,fVar17,fVar18);
          Vector<float,_2>::Vector(&local_4a0,fVar19,fVar20);
          Vector<float,_2>::Vector(&local_4a8,fVar21,fVar22);
          bVar3 = isTrilinearCompareValid
                            (compareMode,prec,(Vec4 *)&c00.s,(Vec4 *)&c00_1.t,&local_490,&local_498,
                             &local_4a0,&local_4a8,fBounds,cmpReference,result,isFixedPointDepth_00)
          ;
          if (bVar3) {
            return true;
          }
        }
      }
    }
    minA0 = (float)((int)minA0 + 1);
  } while( true );
}

Assistant:

static bool isSeamplessLinearMipmapLinearCompareResultValid (const TextureCubeView&			texture,
															 const int						baseLevelNdx,
															 const Sampler&					sampler,
															 const TexComparePrecision&		prec,
															 const CubeFaceFloatCoords&		coords,
															 const Vec2&					fBounds,
															 const float					cmpReference,
															 const float					result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getLevelFace(baseLevelNdx, CUBEFACE_NEGATIVE_X).getFormat());
	const int	size0				= texture.getLevelFace(baseLevelNdx,	coords.face).getWidth();
	const int	size1				= texture.getLevelFace(baseLevelNdx+1,	coords.face).getWidth();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size0,	coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size1,	coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size0,	coords.t, prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size1,	coords.t, prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int	minI1				= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y()-0.5f);

	tcu::ConstPixelBufferAccess faces0[CUBEFACE_LAST];
	tcu::ConstPixelBufferAccess faces1[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		faces0[face] = texture.getLevelFace(baseLevelNdx,	CubeFace(face));
		faces1[face] = texture.getLevelFace(baseLevelNdx+1,	CubeFace(face));
	}

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);
			Vec4		depths0;

			{
				const CubeFaceIntCoords	c00	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+0, j0+0)), size0);
				const CubeFaceIntCoords	c10	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+1, j0+0)), size0);
				const CubeFaceIntCoords	c01	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+0, j0+1)), size0);
				const CubeFaceIntCoords	c11	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+1, j0+1)), size0);

				// If any of samples is out of both edges, implementations can do pretty much anything according to spec.
				// \todo [2013-07-08 pyry] Test the special case where all corner pixels have exactly the same color.
				if (c00.face == CUBEFACE_LAST || c01.face == CUBEFACE_LAST || c10.face == CUBEFACE_LAST || c11.face == CUBEFACE_LAST)
					return true;

				depths0[0] = lookupDepthNoBorder(faces0[c00.face], sampler, c00.s, c00.t);
				depths0[1] = lookupDepthNoBorder(faces0[c10.face], sampler, c10.s, c10.t);
				depths0[2] = lookupDepthNoBorder(faces0[c01.face], sampler, c01.s, c01.t);
				depths0[3] = lookupDepthNoBorder(faces0[c11.face], sampler, c11.s, c11.t);
			}

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);
					Vec4		depths1;

					{
						const CubeFaceIntCoords	c00	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+0, j1+0)), size1);
						const CubeFaceIntCoords	c10	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+1, j1+0)), size1);
						const CubeFaceIntCoords	c01	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+0, j1+1)), size1);
						const CubeFaceIntCoords	c11	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+1, j1+1)), size1);

						if (c00.face == CUBEFACE_LAST || c01.face == CUBEFACE_LAST || c10.face == CUBEFACE_LAST || c11.face == CUBEFACE_LAST)
							return true;

						depths1[0] = lookupDepthNoBorder(faces1[c00.face], sampler, c00.s, c00.t);
						depths1[1] = lookupDepthNoBorder(faces1[c10.face], sampler, c10.s, c10.t);
						depths1[2] = lookupDepthNoBorder(faces1[c01.face], sampler, c01.s, c01.t);
						depths1[3] = lookupDepthNoBorder(faces1[c11.face], sampler, c11.s, c11.t);
					}


					if (isTrilinearCompareValid(sampler.compare, prec, depths0, depths1,
												Vec2(minA0, maxA0), Vec2(minB0, maxB0),
												Vec2(minA1, maxA1), Vec2(minB1, maxB1),
												fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}